

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDEdge::MarkedFaceCount(ON_SubDEdge *this)

{
  bool bVar1;
  ulong uVar2;
  ON_SubDFace *f;
  ON_SubDFacePtr *pOStack_20;
  unsigned_short efi;
  ON_SubDFacePtr *fptr;
  uint mark_count;
  ON_SubDEdge *this_local;
  
  fptr._4_4_ = 0;
  pOStack_20 = this->m_face2;
  f._6_2_ = 0;
  while ((f._6_2_ < this->m_face_count &&
         ((f._6_2_ != 2 || (pOStack_20 = this->m_facex, pOStack_20 != (ON_SubDFacePtr *)0x0))))) {
    uVar2 = pOStack_20->m_ptr & 0xfffffffffffffff8;
    if ((uVar2 != 0) &&
       (bVar1 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(uVar2 + 0x10)), bVar1)) {
      fptr._4_4_ = fptr._4_4_ + 1;
    }
    f._6_2_ = f._6_2_ + 1;
    pOStack_20 = pOStack_20 + 1;
  }
  return fptr._4_4_;
}

Assistant:

unsigned int ON_SubDEdge::MarkedFaceCount() const
{
  unsigned int mark_count = 0;
  const ON_SubDFacePtr* fptr = m_face2;
  for (unsigned short efi = 0; efi < m_face_count; ++efi, ++fptr)
  {
    if (2 == efi)
    {
      fptr = m_facex;
      if (nullptr == fptr)
        break;
    }
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(fptr->m_ptr);
    if (nullptr != f && f->m_status.RuntimeMark())
      ++mark_count;
  }
  return mark_count;
}